

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::free_node(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
            *this,node *n)

{
  bool bVar1;
  leaf_node *in_RSI;
  long in_RDI;
  alloc_type a_1;
  inner_node *in;
  alloc_type a;
  leaf_node *ln;
  leaf_node *in_stack_ffffffffffffffa8;
  inner_node *__p;
  new_allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::inner_node>
  *in_stack_ffffffffffffffb0;
  new_allocator<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::leaf_node>
  *this_00;
  undefined1 local_39 [32];
  new_allocator<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::leaf_node>
  local_19;
  leaf_node *local_18;
  leaf_node *local_10;
  
  local_10 = in_RSI;
  bVar1 = node::isleafnode(&in_RSI->super_node);
  if (bVar1) {
    local_18 = local_10;
    this_00 = &local_19;
    leaf_node_allocator((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                         *)in_stack_ffffffffffffffa8);
    __gnu_cxx::
    new_allocator<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::leaf_node>
    ::
    destroy<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::leaf_node>
              (this_00,local_18);
    __gnu_cxx::
    new_allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::leaf_node>
    ::deallocate((new_allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::leaf_node>
                  *)this_00,in_stack_ffffffffffffffa8,0x109669);
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
    std::
    allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::leaf_node>
    ::~allocator((allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::leaf_node>
                  *)0x109686);
  }
  else {
    local_39._1_8_ = local_10;
    __p = (inner_node *)local_39;
    inner_node_allocator
              ((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                *)__p);
    __gnu_cxx::
    new_allocator<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::inner_node>
    ::
    destroy<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::inner_node>
              ((new_allocator<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::inner_node>
                *)__p,(inner_node *)local_39._1_8_);
    __gnu_cxx::
    new_allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::inner_node>
    ::deallocate(in_stack_ffffffffffffffb0,__p,0x1096e3);
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + -1;
    std::
    allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::inner_node>
    ::~allocator((allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::inner_node>
                  *)0x109700);
  }
  return;
}

Assistant:

inline void free_node(node *n)
        {
            if (n->isleafnode()) {
                leaf_node *ln = static_cast<leaf_node*>(n);
                typename leaf_node::alloc_type a(leaf_node_allocator());
                a.destroy(ln);
                a.deallocate(ln, 1);
                m_stats.leaves--;
            }
            else {
                inner_node *in = static_cast<inner_node*>(n);
                typename inner_node::alloc_type a(inner_node_allocator());
                a.destroy(in);
                a.deallocate(in, 1);
                m_stats.innernodes--;
            }
        }